

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::detail::resolveSymlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  ssize_t sVar4;
  int *piVar5;
  error_category *peVar6;
  pointer pcVar7;
  size_type __n;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_69;
  _Alloc_hider local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  vector<char,_std::allocator<char>_> local_48;
  
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  __n = 0x100;
  do {
    local_68._M_p = local_68._M_p & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,__n,(value_type *)&local_68,&local_69);
    sVar4 = readlink((p->_path)._M_dataplus._M_p,
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if (sVar4 < 0) {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      peVar6 = (error_category *)std::_V2::system_category();
      ec->_M_value = iVar2;
      ec->_M_cat = peVar6;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
LAB_0015ced4:
      bVar3 = false;
    }
    else {
      if (sVar4 < (int)__n) {
        pcVar7 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68._M_p = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar4);
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
        if (local_68._M_p == &local_58) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
          *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_50;
        }
        else {
          (__return_storage_ptr__->_path)._M_dataplus._M_p = local_68._M_p;
          (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
               CONCAT71(uStack_57,local_58);
        }
        (__return_storage_ptr__->_path)._M_string_length = local_60;
        local_60 = 0;
        local_58 = '\0';
        local_68._M_p = &local_58;
        path::postprocess_path_with_format(__return_storage_ptr__,(format)pcVar7);
        if (local_68._M_p != &local_58) {
          operator_delete(local_68._M_p);
        }
        goto LAB_0015ced4;
      }
      __n = __n * 2;
      bVar3 = true;
    }
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

GHC_INLINE path resolveSymlink(const path& p, std::error_code& ec)
{
#ifdef GHC_OS_WINDOWS
    path result;
    auto reparseData = detail::getReparseData(p, ec);
    if (!ec) {
        if (reparseData && IsReparseTagMicrosoft(reparseData->ReparseTag)) {
            switch (reparseData->ReparseTag) {
                case IO_REPARSE_TAG_SYMLINK: {
                    auto printName = std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.PrintNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.PrintNameLength / sizeof(WCHAR));
                    auto substituteName =
                        std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    if (detail::endsWith(substituteName, printName) && detail::startsWith(substituteName, std::wstring(L"\\??\\"))) {
                        result = printName;
                    }
                    else {
                        result = substituteName;
                    }
                    if (reparseData->SymbolicLinkReparseBuffer.Flags & 0x1 /*SYMLINK_FLAG_RELATIVE*/) {
                        result = p.parent_path() / result;
                    }
                    break;
                }
                case IO_REPARSE_TAG_MOUNT_POINT:
                    result = detail::getFullPathName(GHC_NATIVEWP(p), ec);
                    // result = std::wstring(&reparseData->MountPointReparseBuffer.PathBuffer[reparseData->MountPointReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->MountPointReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    break;
                default:
                    break;
            }
        }
    }
    return result;
#else
    size_t bufferSize = 256;
    while (true) {
        std::vector<char> buffer(bufferSize, static_cast<char>(0));
        auto rc = ::readlink(p.c_str(), buffer.data(), buffer.size());
        if (rc < 0) {
            ec = detail::make_system_error();
            return path();
        }
        else if (rc < static_cast<int>(bufferSize)) {
            return path(std::string(buffer.data(), static_cast<std::string::size_type>(rc)));
        }
        bufferSize *= 2;
    }
    return path();
#endif
}